

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

common_log * common_log_main(void)

{
  int iVar1;
  
  if (common_log_main()::log == '\0') {
    iVar1 = __cxa_guard_acquire(&common_log_main()::log);
    if (iVar1 != 0) {
      common_log::common_log(&common_log_main::log,0x100);
      __cxa_atexit(common_log::~common_log,&common_log_main::log,&__dso_handle);
      __cxa_guard_release(&common_log_main()::log);
    }
  }
  return &common_log_main::log;
}

Assistant:

struct common_log * common_log_main() {
    static struct common_log log;

    return &log;
}